

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O1

void __thiscall TestClass::onTimeout(TestClass *this,uint32_t private_data)

{
  int iVar1;
  
  if (private_data == 0x929) {
    iVar1 = (uint)this + 0x20;
    EventDispatcher::remove(iVar1);
    EventDispatcher::remove(iVar1);
    Timer::addTimer((TimerListener *)this->mDefaultTimer,(uint)this,2000);
    Func1(this);
    Func2(this,10,0xf);
    return;
  }
  return;
}

Assistant:

void TestClass::onTimeout( uint32_t private_data )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	LOG( "private_data %d", private_data );
	
	// Make sure we can add and remove from the TimerManager while we are
	// handling a timeout via the TimerListener interface (this happens
	// on the TimerManager thread)
	if ( private_data == 2345 )
	{
		LOG( "\n\nRemoving event1 and event2 from clockthread context\n\n" );
		mThread.remove( Event1::GetEventId() );
		mThread.remove( Event2::GetEventId() );
		
		LOG( "\n\nAdding timeout from clockthread context\n\n" );
		mDefaultTimer->addTimer( this, 2000, 6669 );
		
		LOG( "\n\nCalling Func1 and Func2 again to resend timed events\n\n");
		Func1();
		Func2( 10, 15 );
	}
}